

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metatype_create.cpp
# Opt level: O2

metatype * mpt::metatype::create(char *val,int len)

{
  bool bVar1;
  size_t sVar2;
  metatype *pmVar3;
  metatype *pmVar4;
  ssize_t sVar5;
  encode_array *this;
  
  if (len < 0) {
    if (val == (char *)0x0) {
      bVar1 = false;
      len = 0;
      goto LAB_00131084;
    }
    sVar2 = strlen(val);
    len = (int)sVar2;
  }
  else if (val == (char *)0x0) {
    bVar1 = false;
    goto LAB_00131084;
  }
  bVar1 = true;
  if ((len < 0xff) && (pmVar3 = &basic::create(val,len)->super_metatype, pmVar3 != (metatype *)0x0))
  {
    return pmVar3;
  }
LAB_00131084:
  pmVar4 = io::buffer::metatype::create((array *)0x0);
  if (bVar1 && pmVar4 != (metatype *)0x0) {
    if ((len == 0) ||
       (sVar5 = encode_array::push(&(pmVar4->super_buffer).super_encode_array,(long)len,val),
       -1 < sVar5)) {
      this = &(pmVar4->super_buffer).super_encode_array;
      encode_array::push(this,1,"");
      encode_array::push(this,0,(void *)0x0);
    }
    else {
      (*(pmVar4->super_metatype).super_convertable._vptr_convertable[1])(pmVar4);
      pmVar4 = (metatype *)0x0;
    }
  }
  return &pmVar4->super_metatype;
}

Assistant:

metatype *metatype::create(const char *val, int len)
{
	if (len < 0) {
		len = val ? strlen(val) : 0;
	}
	// compatible small generic metatype
	if (val && len < std::numeric_limits<uint8_t>::max()) {
		metatype *m = metatype::basic::create(val, len);
		if (m) {
			return m;
		}
	}
	// create buffer-backed text metatype
	io::buffer::metatype *b;
	if ((b = mpt::io::buffer::metatype::create(0))
	 && val) {
		if (len && b->push(len, val) < 0) {
			b->unref();
			return 0;
		}
		b->push(1, "\0"); // terminate string
		b->push(0, 0);    // mark content finished
	}
	return b;
}